

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O1

size_t ecpIsSafeGroup_deep(size_t n)

{
  size_t n_00;
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  
  n_00 = n + 1;
  sVar1 = priIsPrime_deep(n_00);
  sVar2 = zzMod_deep(n,n_00);
  sVar3 = zzMulMod_deep(n_00);
  sVar1 = utilMax(3,sVar1,sVar2,sVar3);
  return sVar1 + n_00 * 0x10;
}

Assistant:

size_t ecpIsSafeGroup_deep(size_t n)
{
	const size_t n1 = n + 1;
	return O_OF_W(2 * n1) +
		utilMax(3,
			priIsPrime_deep(n1),
			zzMod_deep(n, n1),
			zzMulMod_deep(n1));
}